

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

void __thiscall QTreeView::doItemsLayout(QTreeView *this)

{
  QAbstractItemModel *pQVar1;
  bool bVar2;
  QTreeViewPrivate *pQVar3;
  ulong uVar4;
  QTreeViewPrivate *in_RDI;
  long in_FS_OFFSET;
  QTreeViewPrivate *d;
  QModelIndex parent;
  iterator it;
  QSet<QPersistentModelIndex> *in_stack_ffffffffffffff38;
  QSet<QPersistentModelIndex> *in_stack_ffffffffffffff40;
  QTreeViewPrivate *i;
  QPersistentModelIndex in_stack_ffffffffffffff60;
  iterator local_78 [2];
  iterator local_58 [2];
  undefined1 in_stack_ffffffffffffffd2;
  undefined1 in_stack_ffffffffffffffd3;
  int in_stack_ffffffffffffffd4;
  QTreeViewPrivate *in_stack_ffffffffffffffd8;
  iterator local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  i = in_RDI;
  pQVar3 = d_func((QTreeView *)0x8fa460);
  if ((pQVar3->hasRemovedItems & 1U) != 0) {
    pQVar3->hasRemovedItems = false;
    local_18.i.i.d =
         (Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *)&DAT_aaaaaaaaaaaaaaaa;
    local_18.i.i.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
    QSet<QPersistentModelIndex>::begin((QSet<QPersistentModelIndex> *)i);
    while( true ) {
      QSet<QPersistentModelIndex>::end((QSet<QPersistentModelIndex> *)i);
      bVar2 = QSet<QPersistentModelIndex>::iterator::operator!=
                        ((iterator *)in_stack_ffffffffffffff40,(iterator *)in_stack_ffffffffffffff38
                        );
      if (!bVar2) break;
      QSet<QPersistentModelIndex>::iterator::operator->((iterator *)0x8fa4fe);
      uVar4 = QPersistentModelIndex::isValid();
      if ((uVar4 & 1) == 0) {
        in_stack_ffffffffffffff40 = &pQVar3->expandedIndexes;
        QSet<QPersistentModelIndex>::const_iterator::const_iterator
                  ((const_iterator *)in_stack_ffffffffffffff40,(iterator *)in_stack_ffffffffffffff38
                  );
        QSet<QPersistentModelIndex>::erase
                  ((QSet<QPersistentModelIndex> *)in_stack_ffffffffffffff60.d,(const_iterator *)i);
        QSet<QPersistentModelIndex>::iterator::operator=
                  (&local_18,(iterator *)&stack0xffffffffffffffc8);
      }
      else {
        QSet<QPersistentModelIndex>::iterator::operator++((iterator *)in_stack_ffffffffffffff40);
      }
    }
    QSet<QPersistentModelIndex>::begin((QSet<QPersistentModelIndex> *)i);
    QSet<QPersistentModelIndex>::iterator::operator=(&local_18,local_58);
    while( true ) {
      QSet<QPersistentModelIndex>::end((QSet<QPersistentModelIndex> *)i);
      bVar2 = QSet<QPersistentModelIndex>::iterator::operator!=
                        ((iterator *)in_stack_ffffffffffffff40,(iterator *)in_stack_ffffffffffffff38
                        );
      if (!bVar2) break;
      QSet<QPersistentModelIndex>::iterator::operator->((iterator *)0x8fa5d5);
      uVar4 = QPersistentModelIndex::isValid();
      if ((uVar4 & 1) == 0) {
        in_stack_ffffffffffffff38 = &pQVar3->hiddenIndexes;
        QSet<QPersistentModelIndex>::const_iterator::const_iterator
                  ((const_iterator *)in_stack_ffffffffffffff40,(iterator *)in_stack_ffffffffffffff38
                  );
        QSet<QPersistentModelIndex>::erase
                  ((QSet<QPersistentModelIndex> *)in_stack_ffffffffffffff60.d,(const_iterator *)i);
        QSet<QPersistentModelIndex>::iterator::operator=(&local_18,local_78);
      }
      else {
        QSet<QPersistentModelIndex>::iterator::operator++((iterator *)in_stack_ffffffffffffff40);
      }
    }
  }
  QList<QTreeViewItem>::clear((QList<QTreeViewItem> *)in_stack_ffffffffffffff40);
  QPersistentModelIndex::operator_cast_to_QModelIndex
            ((QPersistentModelIndex *)&stack0xffffffffffffff60);
  pQVar1 = (pQVar3->super_QAbstractItemViewPrivate).model;
  uVar4 = (**(code **)(*(long *)pQVar1 + 0x88))(pQVar1,&stack0xffffffffffffff60);
  if ((uVar4 & 1) != 0) {
    QTreeViewPrivate::layout
              (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,(bool)in_stack_ffffffffffffffd3,
               (bool)in_stack_ffffffffffffffd2);
  }
  QAbstractItemView::doItemsLayout((QAbstractItemView *)in_stack_ffffffffffffff40);
  (**(code **)(*(long *)&(pQVar3->header->super_QAbstractItemView).super_QAbstractScrollArea.
                         super_QFrame.super_QWidget + 0x220))();
  QTreeViewPrivate::updateAccessibility(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTreeView::doItemsLayout()
{
    Q_D(QTreeView);
    if (d->hasRemovedItems) {
        //clean the QSet that may contains old (and this invalid) indexes
        d->hasRemovedItems = false;
        QSet<QPersistentModelIndex>::iterator it = d->expandedIndexes.begin();
        while (it != d->expandedIndexes.end()) {
            if (!it->isValid())
                it = d->expandedIndexes.erase(it);
            else
                ++it;
        }
        it = d->hiddenIndexes.begin();
        while (it != d->hiddenIndexes.end()) {
            if (!it->isValid())
                it = d->hiddenIndexes.erase(it);
            else
                ++it;
        }
    }
    d->viewItems.clear(); // prepare for new layout
    QModelIndex parent = d->root;
    if (d->model->hasChildren(parent)) {
        d->layout(-1);
    }
    QAbstractItemView::doItemsLayout();
    d->header->doItemsLayout();
    d->updateAccessibility();
}